

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS
ref_metric_limit_h_at_complexity
          (REF_DBL *metric,REF_GRID ref_grid,REF_DBL hmin,REF_DBL hmax,REF_DBL target_complexity)

{
  REF_NODE pRVar1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  REF_DBL *pRVar6;
  char *pcVar7;
  int iVar8;
  long lVar9;
  double dVar10;
  REF_DBL current_complexity;
  double local_70;
  REF_DBL local_68;
  REF_DBL local_60;
  double local_58;
  REF_DBL local_48;
  
  pRVar1 = ref_grid->node;
  local_58 = target_complexity;
  if (target_complexity <= -target_complexity) {
    local_58 = -target_complexity;
  }
  iVar8 = 0;
  local_68 = hmin;
  local_60 = hmax;
  local_48 = target_complexity;
  do {
    uVar2 = ref_metric_complexity(metric,ref_grid,&local_70);
    if (uVar2 != 0) {
      pcVar7 = "cmp";
      uVar4 = 0x85a;
LAB_001a832e:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             uVar4,"ref_metric_limit_h_at_complexity",(ulong)uVar2,pcVar7);
      return uVar2;
    }
    dVar10 = local_70 * 1e+20;
    if (dVar10 <= -dVar10) {
      dVar10 = -dVar10;
    }
    if (dVar10 <= local_58) {
      return 4;
    }
    iVar3 = pRVar1->max;
    if (0 < iVar3) {
      lVar9 = 0;
      pRVar6 = metric;
      do {
        if (-1 < pRVar1->global[lVar9]) {
          lVar5 = 0;
          do {
            dVar10 = pow(local_48 / local_70,0.6666666666666666);
            pRVar6[lVar5] = dVar10 * pRVar6[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar5 != 6);
          iVar3 = pRVar1->max;
        }
        lVar9 = lVar9 + 1;
        pRVar6 = pRVar6 + 6;
      } while (lVar9 < iVar3);
    }
    uVar2 = ref_metric_limit_h(metric,ref_grid,local_68,local_60);
    if (uVar2 != 0) {
      pcVar7 = "limit h";
      uVar4 = 0x862;
      goto LAB_001a832e;
    }
    iVar8 = iVar8 + 1;
    if (iVar8 == 10) {
      return 0;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_metric_limit_h_at_complexity(REF_DBL *metric,
                                                    REF_GRID ref_grid,
                                                    REF_DBL hmin, REF_DBL hmax,
                                                    REF_DBL target_complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT i, node, relaxations;
  REF_DBL current_complexity;

  /* global scaling and h limits */
  for (relaxations = 0; relaxations < 10; relaxations++) {
    RSS(ref_metric_complexity(metric, ref_grid, &current_complexity), "cmp");
    if (!ref_math_divisible(target_complexity, current_complexity)) {
      return REF_DIV_ZERO;
    }
    each_ref_node_valid_node(ref_node, node) for (i = 0; i < 6; i++) {
      metric[i + 6 * node] *=
          pow(target_complexity / current_complexity, 2.0 / 3.0);
    }
    RSS(ref_metric_limit_h(metric, ref_grid, hmin, hmax), "limit h");
  }

  return REF_SUCCESS;
}